

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

void write_golomb(aom_writer *w,int level)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  int length;
  int i;
  int x;
  undefined4 local_18;
  
  local_18 = 0;
  iVar1 = in_ESI + 1;
  for (iVar2 = iVar1; iVar2 != 0; iVar2 = iVar2 >> 1) {
    local_18 = local_18 + 1;
  }
  for (iVar2 = 0; iVar2 < local_18 + -1; iVar2 = iVar2 + 1) {
    aom_write_bit((aom_writer *)CONCAT44(in_ESI,iVar1),iVar2);
  }
  while (local_18 = local_18 + -1, -1 < local_18) {
    aom_write_bit((aom_writer *)CONCAT44(in_ESI,iVar1),local_18);
  }
  return;
}

Assistant:

static void write_golomb(aom_writer *w, int level) {
  int x = level + 1;
  int i = x;
  int length = 0;

  while (i) {
    i >>= 1;
    ++length;
  }
  assert(length > 0);

  for (i = 0; i < length - 1; ++i) aom_write_bit(w, 0);

  for (i = length - 1; i >= 0; --i) aom_write_bit(w, (x >> i) & 0x01);
}